

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effective_info.c
# Opt level: O0

double inform_effective_info(double *tpm,double *inter,size_t n,inform_error *err)

{
  double dVar1;
  int iVar2;
  double *qs;
  double dVar3;
  undefined1 auVar4 [16];
  double *local_78;
  double *sf;
  double ei;
  size_t j;
  size_t i_1;
  size_t i;
  double k;
  double *id;
  double *ed;
  double *data;
  inform_error *err_local;
  size_t n_local;
  double *inter_local;
  double *tpm_local;
  
  iVar2 = check_arguments(tpm,inter,n,err);
  if (iVar2 == 0) {
    qs = (double *)calloc(n << 1,8);
    if (qs == (double *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      tpm_local = (double *)0x7ff8000000000000;
    }
    else {
      k = (double)inter;
      if (inter == (double *)0x0) {
        auVar4._8_4_ = (int)(n >> 0x20);
        auVar4._0_8_ = n;
        auVar4._12_4_ = 0x45300000;
        for (i_1 = 0; i_1 < n; i_1 = i_1 + 1) {
          qs[i_1 + n] = 1.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0));
        }
        k = (double)(qs + n);
      }
      for (j = 0; j < n; j = j + 1) {
        for (ei = 0.0; (ulong)ei < n; ei = (double)((long)ei + 1)) {
          qs[(long)ei] = *(double *)((long)k + j * 8) * tpm[(long)ei + j * n] + qs[(long)ei];
        }
      }
      sf = (double *)0x0;
      for (local_78 = tpm; local_78 != tpm + n * n; local_78 = local_78 + n) {
        dVar1 = *(double *)k;
        dVar3 = kldivergence(local_78,qs,n);
        sf = (double *)(dVar1 * dVar3 + (double)sf);
        k = (double)((long)k + 8);
      }
      free(qs);
      tpm_local = sf;
    }
  }
  else {
    tpm_local = (double *)0x7ff8000000000000;
  }
  return (double)tpm_local;
}

Assistant:

double inform_effective_info(double const *tpm, double const *inter, size_t n,
    inform_error *err)
{
    if (check_arguments(tpm, inter, n, err))
    {
        return NAN;
    }

    // allocate enough memory for the ID and ED distributions
    double *data = calloc(2 * n, sizeof(double));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    // set the ID and ED pointers to pointer the right places
    double *ed = data;
    double const *id;
    if (inter != NULL)
    {
        id = inter;
    }
    else
    {
        // make the ID distribution uniform
        double const k = 1.0 / n;
        for (size_t i = 0; i < n; ++i) data[i + n] = k;
        id = (double const *) data + n;
    }

    // compute the ED given the ID and TPM
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < n; ++j)
        {
            ed[j] += id[i] * tpm[j + i*n];
        }
    }

    // and comput the effective information
    double ei = 0.0;
    for (double const *sf = tpm; sf != tpm + n*n; sf += n, ++id)
    {
        ei += (*id) * kldivergence(sf, ed, n);
    }

    free(data);

    return ei;
}